

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstructCondense<double>::ComputeWeightsLocal
          (TPZDohrSubstructCondense<double> *this,TPZFMatrix<double> *StiffnessDiagLocal)

{
  double dVar1;
  int iVar2;
  TPZVec<int> *pTVar3;
  int *piVar4;
  double *pdVar5;
  int64_t iVar6;
  int64_t in_RSI;
  TPZFMatrix<double> *in_RDI;
  int nc;
  int c;
  TPZVec<int> *gather;
  int neqs;
  TPZVec<int> *scatter;
  int i;
  undefined8 in_stack_ffffffffffffff88;
  double dVar7;
  TPZDohrSubstructCondense<double> *in_stack_ffffffffffffff90;
  TPZVec<double> *in_stack_ffffffffffffff98;
  TPZFMatrix<double> *in_stack_ffffffffffffffa0;
  int local_34;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar8;
  TPZFMatrix<double> *this_00;
  
  this_00 = in_RDI;
  pTVar3 = ScatterVec(in_stack_ffffffffffffff90,
                      (ENumbering)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                      (ENumbering)in_stack_ffffffffffffff88);
  iVar2._0_1_ = (in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  iVar2._1_1_ = (in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive;
  iVar2._2_2_ = *(undefined2 *)&(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.field_0x1a;
  for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
    in_stack_ffffffffffffffa0 = (TPZFMatrix<double> *)&in_RDI[2].fPivot.super_TPZVec<int>.fStore;
    piVar4 = TPZVec<int>::operator[](pTVar3,(long)iVar8);
    pdVar5 = TPZVec<double>::operator[]((TPZVec<double> *)in_stack_ffffffffffffffa0,(long)*piVar4);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,
                        (int64_t)in_stack_ffffffffffffff90);
    dVar1 = *pdVar5;
    piVar4 = TPZVec<int>::operator[](pTVar3,(long)iVar8);
    pdVar5 = TPZVec<double>::operator[]
                       ((TPZVec<double> *)&in_RDI[2].fPivot.super_TPZVec<int>.fStore,(long)*piVar4);
    *pdVar5 = dVar7 / dVar1;
  }
  for (; iVar8 < (int)(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol; iVar8 = iVar8 + 1)
  {
    in_stack_ffffffffffffff98 = (TPZVec<double> *)&in_RDI[2].fPivot.super_TPZVec<int>.fStore;
    piVar4 = TPZVec<int>::operator[](pTVar3,(long)iVar8);
    pdVar5 = TPZVec<double>::operator[](in_stack_ffffffffffffff98,(long)*piVar4);
    *pdVar5 = 1.0;
  }
  pTVar3 = GatherVec(in_stack_ffffffffffffff90,
                     (ENumbering)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (ENumbering)in_stack_ffffffffffffff88);
  iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)&(in_RDI->fPivot).super_TPZVec<int>.fStore);
  TPZFMatrix<double>::Resize(this_00,in_RSI,CONCAT44(iVar8,in_stack_ffffffffffffffe8));
  for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
    for (local_34 = 0; local_34 < (int)iVar6; local_34 = local_34 + 1) {
      TPZVec<int>::operator[](pTVar3,(long)iVar8);
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,
                          (int64_t)in_stack_ffffffffffffff90);
      dVar7 = *pdVar5;
      piVar4 = TPZVec<int>::operator[](pTVar3,(long)iVar8);
      pdVar5 = TPZVec<double>::operator[]
                         ((TPZVec<double> *)&in_RDI[2].fPivot.super_TPZVec<int>.fStore,(long)*piVar4
                         );
      in_stack_ffffffffffffff90 = (TPZDohrSubstructCondense<double> *)(dVar7 * *pdVar5);
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,
                          (int64_t)in_stack_ffffffffffffff90);
      *pdVar5 = (double)in_stack_ffffffffffffff90;
    }
  }
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::ComputeWeightsLocal(TPZFMatrix<TVar> &StiffnessDiagLocal) {
	int i;
	//fWeights.Fill(1.);
	TPZVec<int> &scatter = ScatterVec(ExternalFirst, Submesh);
	int neqs = fNumExternalEquations;
	for (i=0;i<neqs;i++) {
		fWeights[scatter[i]] = fWeights[scatter[i]] / StiffnessDiagLocal(i,0);
	}
	for(; i<fNEquations; i++)
	{
		fWeights[scatter[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	TPZVec<int> &gather = GatherVec(Submesh, ExternalFirst);
	int c,nc = fPhiC.Cols();
	fPhiC_Weighted_Condensed.Resize(neqs,nc);
	for (i=0;i<neqs;i++) 
	{
		for(c=0; c<nc; c++)
		{
			fPhiC_Weighted_Condensed(i,c) = fPhiC(gather[i],c)*fWeights[gather[i]];
		}
	}
}